

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ControlDependence.h
# Opt level: O1

ValVec * __thiscall
dg::LLVMControlDependenceAnalysis::_getDependencies<llvm::BasicBlock_const*>
          (ValVec *__return_storage_ptr__,LLVMControlDependenceAnalysis *this,BasicBlock *v)

{
  ValVec interproc;
  void *local_30;
  undefined8 local_28;
  long local_20;
  
  (**(code **)(**(long **)(this + 0x68) + 0x38))();
  if (this[100] == (LLVMControlDependenceAnalysis)0x1) {
    (**(code **)(**(long **)(this + 0x70) + 0x38))(&local_30,*(long **)(this + 0x70),v);
    std::vector<llvm::Value*,std::allocator<llvm::Value*>>::
    _M_range_insert<__gnu_cxx::__normal_iterator<llvm::Value**,std::vector<llvm::Value*,std::allocator<llvm::Value*>>>>
              ((vector<llvm::Value*,std::allocator<llvm::Value*>> *)__return_storage_ptr__,
               (__return_storage_ptr__->
               super__Vector_base<llvm::Value_*,_std::allocator<llvm::Value_*>_>)._M_impl.
               super__Vector_impl_data._M_finish,local_30,local_28);
    if (local_30 != (void *)0x0) {
      operator_delete(local_30,local_20 - (long)local_30);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

ValVec _getDependencies(ValT v) {
        assert(_impl);
        auto ret = _impl->getDependencies(v);

        if (getOptions().interproceduralCD()) {
            assert(_interprocImpl);
            auto interproc = _interprocImpl->getDependencies(v);
            ret.insert(ret.end(), interproc.begin(), interproc.end());
        }
        return ret;
    }